

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshExporter.cpp
# Opt level: O1

void chrono::fea::ChMeshExporter::writeFrame
               (shared_ptr<chrono::fea::ChMesh> *my_mesh,char *SaveAsBuffer,string *MeshFileBuffer)

{
  element_type *peVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  pointer psVar10;
  long *plVar11;
  ChElementShellANCF_3423 *pCVar12;
  int iVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  uint i;
  ulong uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ChVector<double> StrainV;
  double scalar;
  string SaveAsBuffer_string;
  ChStrainStress3D strainStressOut;
  ofstream output;
  ifstream CopyFrom;
  double local_518;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_510;
  double local_508;
  double local_4f8;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  long *local_4d8;
  long local_4d0;
  long local_4c8 [2];
  ChVector<double> local_4b8;
  ChStrainStress3D local_498;
  long local_438;
  filebuf local_430 [240];
  ios_base local_340 [264];
  long *local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  long local_228 [63];
  
  std::ofstream::ofstream(&local_438);
  std::__cxx11::string::string((string *)&local_4d8,SaveAsBuffer,(allocator *)&local_238);
  std::__cxx11::string::erase((ulong)&local_4d8,local_4d0 - 4);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_4d8,local_4d0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_4d8,(long)local_4d8 + local_4d0);
  std::__cxx11::string::append((char *)&local_238);
  snprintf(SaveAsBuffer,0x100,"%s",local_238);
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  std::ofstream::open((char *)&local_438,(_Ios_Openmode)SaveAsBuffer);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_438,"# vtk DataFile Version 2.0",0x1a);
  std::ios::widen((char)(ostream *)&local_438 + (char)*(undefined8 *)(local_438 + -0x18));
  std::ostream::put((char)&local_438);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_438,"Unstructured Grid Example",0x19);
  std::ios::widen((char)(ostream *)&local_438 + (char)*(undefined8 *)(local_438 + -0x18));
  std::ostream::put((char)&local_438);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"ASCII",5);
  std::ios::widen((char)(ostream *)&local_438 + (char)*(undefined8 *)(local_438 + -0x18));
  std::ostream::put((char)&local_438);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_438,"DATASET UNSTRUCTURED_GRID",0x19);
  std::ios::widen((char)(ostream *)&local_438 + (char)*(undefined8 *)(local_438 + -0x18));
  std::ostream::put((char)&local_438);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"POINTS ",7);
  (*(((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_438);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," float\n",7);
  uVar17 = 0;
  while( true ) {
    uVar5 = (*(((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
    if (uVar5 <= (uint)uVar17) break;
    peVar1 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar1->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
              (&local_238,peVar1,uVar17);
    if (local_238 == (long *)0x0) {
      lVar8 = 0;
    }
    else {
      lVar8 = __dynamic_cast(local_238,&ChNodeBase::typeinfo,&ChNodeFEAxyz::typeinfo,
                             0xffffffffffffffff);
    }
    if (lVar8 == 0) {
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      lVar8 = 0;
    }
    else {
      p_Var16 = local_230;
      if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_230->_M_use_count = local_230->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_230->_M_use_count = local_230->_M_use_count + 1;
        }
      }
    }
    if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230);
    }
    poVar7 = std::ostream::_M_insert<double>(*(double *)(lVar8 + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<double>(*(double *)(lVar8 + 0x28));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<double>(*(double *)(lVar8 + 0x30));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    }
    uVar17 = (ulong)((uint)uVar17 + 1);
  }
  std::ifstream::ifstream(&local_238,(string *)MeshFileBuffer,_S_in);
  std::ostream::operator<<(&local_438,(streambuf *)local_228);
  peVar1 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar10 = (peVar1->velements).
            super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(peVar1->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar10 & 0xffffffff0U) == 0) {
    iVar13 = 0;
  }
  else {
    lVar8 = 8;
    uVar17 = 0;
    iVar13 = 0;
    do {
      lVar9 = *(long *)((long)psVar10 + lVar8 + -8);
      p_Var16 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar10->
                         super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr + lVar8);
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        }
      }
      if (lVar9 == 0) {
        bVar18 = true;
      }
      else {
        lVar9 = __dynamic_cast(lVar9,&ChElementBase::typeinfo,&ChElementCableANCF::typeinfo,0);
        bVar18 = lVar9 == 0;
      }
      p_Var15 = p_Var16;
      if (bVar18) {
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if ((p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (!bVar18)) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          UNLOCK();
          p_Var15 = p_Var16;
        }
        else {
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          p_Var15 = p_Var16;
        }
      }
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
      }
      uVar5 = 1;
      if (bVar18) {
        psVar10 = (((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->velements).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = *(long *)((long)psVar10 + lVar8 + -8);
        p_Var16 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar10->
                           super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar8);
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
        }
        if (lVar9 == 0) {
          bVar18 = true;
        }
        else {
          lVar9 = __dynamic_cast(lVar9,&ChElementBase::typeinfo,&ChElementShellANCF_3423::typeinfo,0
                                );
          bVar18 = lVar9 == 0;
        }
        p_Var15 = p_Var16;
        if (bVar18 != false) {
          p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if ((p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (bVar18 == false)) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
            p_Var15 = p_Var16;
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            p_Var15 = p_Var16;
          }
        }
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
        uVar5 = (uint)(bVar18 ^ 1);
      }
      iVar13 = iVar13 + uVar5;
      uVar17 = uVar17 + 1;
      peVar1 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      psVar10 = (peVar1->velements).
                super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar17 < ((ulong)((long)(peVar1->velements).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar10) >>
                       4 & 0xffffffff));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"\nCELL_DATA ",0xb);
  poVar7 = (ostream *)std::ostream::operator<<(&local_438,iVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_438,"SCALARS Deflection float 1\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_438,"LOOKUP_TABLE default\n",0x15);
  local_4e0 = 0.0;
  peVar1 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar10 = (peVar1->velements).
            super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(peVar1->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar10 & 0xffffffff0U) != 0) {
    lVar8 = 8;
    uVar17 = 0;
    do {
      lVar9 = *(long *)((long)psVar10 + lVar8 + -8);
      p_Var16 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar10->
                         super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr + lVar8);
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        }
      }
      if (lVar9 == 0) {
        lVar9 = 0;
      }
      else {
        lVar9 = __dynamic_cast(lVar9,&ChElementBase::typeinfo,&ChElementCableANCF::typeinfo,0);
      }
      p_Var15 = p_Var16;
      if (lVar9 == 0) {
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if ((p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (lVar9 != 0)) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          UNLOCK();
          p_Var15 = p_Var16;
        }
        else {
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          p_Var15 = p_Var16;
        }
      }
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
      }
      if (lVar9 == 0) {
        psVar10 = (((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->velements).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = *(long *)((long)psVar10 + lVar8 + -8);
        p_Var16 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar10->
                           super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar8);
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
        }
        if (lVar9 == 0) {
          pCVar12 = (ChElementShellANCF_3423 *)0x0;
        }
        else {
          pCVar12 = (ChElementShellANCF_3423 *)
                    __dynamic_cast(lVar9,&ChElementBase::typeinfo,&ChElementShellANCF_3423::typeinfo
                                   ,0);
        }
        p_Var14 = p_Var16;
        if (pCVar12 == (ChElementShellANCF_3423 *)0x0) {
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if ((p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (pCVar12 != (ChElementShellANCF_3423 *)0x0)) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
            p_Var14 = p_Var16;
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            p_Var14 = p_Var16;
          }
        }
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
        if (pCVar12 != (ChElementShellANCF_3423 *)0x0) {
          ChElementShellANCF_3423::EvaluateDeflection(pCVar12,&local_4e0);
        }
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
      }
      else {
        lVar2 = **(long **)(lVar9 + 0x70);
        lVar3 = (*(long **)(lVar9 + 0x70))[2];
        dVar4 = *(double *)(lVar3 + 0x28) - *(double *)(lVar2 + 0x28);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar4 * dVar4;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(double *)(lVar3 + 0x20) - *(double *)(lVar2 + 0x20);
        auVar19 = vfmadd231sd_fma(auVar19,auVar21,auVar21);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(double *)(lVar3 + 0x30) - *(double *)(lVar2 + 0x30);
        auVar19 = vfmadd231sd_fma(auVar19,auVar20,auVar20);
        if (auVar19._0_8_ < 0.0) {
          local_4e0 = sqrt(auVar19._0_8_);
        }
        else {
          auVar19 = vsqrtsd_avx(auVar19,auVar19);
          local_4e0 = auVar19._0_8_;
        }
        local_4e0 = local_4e0 - *(double *)(lVar9 + 0x48);
      }
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
      poVar7 = std::ostream::_M_insert<double>(local_4e0 + 1e-20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      uVar17 = uVar17 + 1;
      peVar1 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      psVar10 = (peVar1->velements).
                super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar17 < ((ulong)((long)(peVar1->velements).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar10) >>
                       4 & 0xffffffff));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_438,"VECTORS Strain float\n",0x15);
  local_518 = 0.0;
  p_Stack_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_508 = 0.0;
  peVar1 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar10 = (peVar1->velements).
            super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(peVar1->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar10 & 0xffffffff0U) != 0) {
    lVar8 = 8;
    uVar17 = 0;
    do {
      lVar9 = *(long *)((long)psVar10 + lVar8 + -8);
      p_Var16 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar10->
                         super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr + lVar8);
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        }
      }
      if (lVar9 == 0) {
        plVar11 = (long *)0x0;
      }
      else {
        plVar11 = (long *)__dynamic_cast(lVar9,&ChElementBase::typeinfo,
                                         &ChElementCableANCF::typeinfo);
      }
      p_Var15 = p_Var16;
      if (plVar11 == (long *)0x0) {
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if ((p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (plVar11 != (long *)0x0)) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          UNLOCK();
          p_Var15 = p_Var16;
        }
        else {
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          p_Var15 = p_Var16;
        }
      }
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
      }
      if (plVar11 == (long *)0x0) {
        psVar10 = (((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->velements).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = *(long *)((long)psVar10 + lVar8 + -8);
        p_Var16 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar10->
                           super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar8);
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
        }
        if (lVar9 == 0) {
          pCVar12 = (ChElementShellANCF_3423 *)0x0;
        }
        else {
          pCVar12 = (ChElementShellANCF_3423 *)
                    __dynamic_cast(lVar9,&ChElementBase::typeinfo,&ChElementShellANCF_3423::typeinfo
                                  );
        }
        p_Var14 = p_Var16;
        if (pCVar12 == (ChElementShellANCF_3423 *)0x0) {
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if ((p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (pCVar12 != (ChElementShellANCF_3423 *)0x0)) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
            p_Var14 = p_Var16;
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            p_Var14 = p_Var16;
          }
        }
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
        if (pCVar12 != (ChElementShellANCF_3423 *)0x0) {
          local_4b8.m_data[0] = 0.0;
          local_4b8.m_data[1] = 0.0;
          local_4b8.m_data[2] = 0.0;
          ChElementShellANCF_3423::EvaluateSectionStrainStress(&local_498,pCVar12,&local_4b8,0);
          local_518 = local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array[0];
          p_Stack_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_498.strain.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
          local_508 = local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array[3];
        }
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
      }
      else {
        (**(code **)(*plVar11 + 200))(0,plVar11,&local_518);
      }
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
      local_518 = local_518 + 1e-20;
      p_Stack_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((double)p_Stack_510 + 1e-20);
      local_508 = local_508 + 1e-20;
      poVar7 = std::ostream::_M_insert<double>(local_518);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      poVar7 = std::ostream::_M_insert<double>((double)p_Stack_510);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      poVar7 = std::ostream::_M_insert<double>(local_508);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      uVar17 = uVar17 + 1;
      peVar1 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      psVar10 = (peVar1->velements).
                super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar17 < ((ulong)((long)(peVar1->velements).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar10) >>
                       4 & 0xffffffff));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"\nPOINT_DATA ",0xc);
  (*(((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_438);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_438,"VECTORS Velocity float\n",0x17);
  for (uVar5 = 0;
      uVar6 = (*(((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])()
      , uVar5 < uVar6; uVar5 = uVar5 + 1) {
    peVar1 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar1->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
              (&local_498,peVar1,(ulong)uVar5);
    if (local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
        m_data.array[0] == 0.0) {
      lVar8 = 0;
    }
    else {
      lVar8 = __dynamic_cast(local_498.strain.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array[0],&ChNodeBase::typeinfo,&ChNodeFEAxyz::typeinfo,
                             0xffffffffffffffff);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
        m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                m_storage.m_data.array[1] + 8) =
             *(_Atomic_word *)
              ((long)local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[1] + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                m_storage.m_data.array[1] + 8) =
             *(_Atomic_word *)
              ((long)local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[1] + 8) + 1;
      }
    }
    local_4e8 = *(double *)(lVar8 + 0x38);
    local_4f0 = *(double *)(lVar8 + 0x40);
    local_4f8 = *(double *)(lVar8 + 0x48);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
        m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                 m_storage.m_data.array[1]);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
        m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                 m_storage.m_data.array[1]);
    }
    poVar7 = std::ostream::_M_insert<double>(local_4e8 + 1e-20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<double>(local_4f0 + 1e-20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<double>(local_4f8 + 1e-20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_438,"VECTORS Acceleration float\n",0x1b);
  for (uVar5 = 0;
      uVar6 = (*(((my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])()
      , uVar5 < uVar6; uVar5 = uVar5 + 1) {
    peVar1 = (my_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar1->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
              (&local_498,peVar1,(ulong)uVar5);
    if (local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
        m_data.array[0] == 0.0) {
      lVar8 = 0;
    }
    else {
      lVar8 = __dynamic_cast(local_498.strain.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array[0],&ChNodeBase::typeinfo,&ChNodeFEAxyz::typeinfo,
                             0xffffffffffffffff);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
        m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                m_storage.m_data.array[1] + 8) =
             *(_Atomic_word *)
              ((long)local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[1] + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                m_storage.m_data.array[1] + 8) =
             *(_Atomic_word *)
              ((long)local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[1] + 8) + 1;
      }
    }
    local_4e8 = *(double *)(lVar8 + 0x50);
    local_4f0 = *(double *)(lVar8 + 0x58);
    local_4f8 = *(double *)(lVar8 + 0x60);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
        m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                 m_storage.m_data.array[1]);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
        m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_498.strain.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                 m_storage.m_data.array[1]);
    }
    poVar7 = std::ostream::_M_insert<double>(local_4e8 + 1e-20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<double>(local_4f0 + 1e-20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<double>(local_4f8 + 1e-20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  }
  std::ofstream::close();
  std::ifstream::~ifstream(&local_238);
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8,local_4c8[0] + 1);
  }
  local_438 = _VTT;
  *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = __M_insert<long>;
  std::filebuf::~filebuf(local_430);
  std::ios_base::~ios_base(local_340);
  return;
}

Assistant:

void ChMeshExporter::writeFrame(std::shared_ptr<ChMesh> my_mesh, char SaveAsBuffer[256], std::string MeshFileBuffer) {
    std::ofstream output;
    std::string SaveAsBuffer_string(SaveAsBuffer);
    SaveAsBuffer_string.erase(SaveAsBuffer_string.length() - 4, 4);
    std::cout << SaveAsBuffer_string << std::endl;
    snprintf(SaveAsBuffer, sizeof(char) * 256, ("%s"), (SaveAsBuffer_string + ".vtk").c_str());
    output.open(SaveAsBuffer, std::ios::trunc);

    output << "# vtk DataFile Version 2.0" << std::endl;
    output << "Unstructured Grid Example" << std::endl;
    output << "ASCII" << std::endl;
    output << "DATASET UNSTRUCTURED_GRID" << std::endl;

    output << "POINTS " << my_mesh->GetNnodes() << " float\n";
    for (unsigned int i = 0; i < my_mesh->GetNnodes(); i++) {
        auto node = std::dynamic_pointer_cast<ChNodeFEAxyz>(my_mesh->GetNode(i));
        output << node->GetPos().x() << " " << node->GetPos().y() << " " << node->GetPos().z() << "\n";
    }

    std::ifstream CopyFrom(MeshFileBuffer);
    output << CopyFrom.rdbuf();

    int numCell = 0;
    for (unsigned int iele = 0; iele < my_mesh->GetNelements(); iele++) {
        if (std::dynamic_pointer_cast<ChElementCableANCF>(my_mesh->GetElement(iele)))
            numCell++;
        else if (std::dynamic_pointer_cast<ChElementShellANCF_3423>(my_mesh->GetElement(iele)))
            numCell++;
    }

    output << "\nCELL_DATA " << numCell << "\n";
    output << "SCALARS Deflection float 1\n";
    output << "LOOKUP_TABLE default\n";

    double scalar = 0;
    for (unsigned int iele = 0; iele < my_mesh->GetNelements(); iele++) {
        if (auto elementC = std::dynamic_pointer_cast<ChElementCableANCF>(my_mesh->GetElement(iele)))
            scalar = elementC->GetCurrLength() - elementC->GetRestLength();
        else if (auto elementS = std::dynamic_pointer_cast<ChElementShellANCF_3423>(my_mesh->GetElement(iele)))
            elementS->EvaluateDeflection(scalar);
        output << scalar + 1e-20 << "\n";
    }

    output << "VECTORS Strain float\n";
    ChVector<> StrainV;
    for (unsigned int iele = 0; iele < my_mesh->GetNelements(); iele++) {
        if (auto elementC = std::dynamic_pointer_cast<ChElementCableANCF>(my_mesh->GetElement(iele)))
            elementC->EvaluateSectionStrain(0.0, StrainV);
        else if (auto elementS = std::dynamic_pointer_cast<ChElementShellANCF_3423>(my_mesh->GetElement(iele))) {
            const ChStrainStress3D strainStressOut =
                elementS->EvaluateSectionStrainStress(ChVector<double>(0, 0, 0), 0);
            StrainV.Set(strainStressOut.strain[0], strainStressOut.strain[1], strainStressOut.strain[3]);
        }
        StrainV += ChVector<>(1e-20);
        output << StrainV.x() << " " << StrainV.y() << " " << StrainV.z() << "\n";
    }

    output << "\nPOINT_DATA " << my_mesh->GetNnodes() << "\n";

    output << "VECTORS Velocity float\n";
    for (unsigned int i = 0; i < my_mesh->GetNnodes(); i++) {
        ChVector<> vel = std::dynamic_pointer_cast<ChNodeFEAxyz>(my_mesh->GetNode(i))->GetPos_dt();
        vel += ChVector<>(1e-20);
        output << (double)vel.x() << " " << (double)vel.y() << " " << (double)vel.z() << "\n";
    }

    output << "VECTORS Acceleration float\n";

    for (unsigned int i = 0; i < my_mesh->GetNnodes(); i++) {
        ChVector<> acc = std::dynamic_pointer_cast<ChNodeFEAxyz>(my_mesh->GetNode(i))->GetPos_dtdt();
        acc += ChVector<>(1e-20);
        output << (double)acc.x() << " " << (double)acc.y() << " " << (double)acc.z() << "\n";
    }

    output.close();
}